

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

Vec4 __thiscall tcu::getTextureBorderColorFloat(tcu *this,TextureFormat *format,Sampler *sampler)

{
  Channel CVar1;
  TextureChannelClass TVar2;
  TextureSwizzle *pTVar3;
  float *pfVar4;
  float fVar5;
  ulong extraout_XMM0_Qa;
  ulong uVar6;
  ulong uVar7;
  Vec4 VVar8;
  float local_48;
  int local_40;
  Channel map;
  int c;
  float valueMax;
  float valueMin;
  bool isSigned;
  bool isFloat;
  Channel *channelMap;
  TextureChannelClass channelClass;
  Sampler *sampler_local;
  TextureFormat *format_local;
  Vec4 *result;
  
  TVar2 = getTextureChannelClass(format->type);
  pTVar3 = getBorderColorReadSwizzle(format->order);
  uVar7 = 0;
  local_48 = -1.0;
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_48 = 0.0;
  }
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar6 = extraout_XMM0_Qa;
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    CVar1 = pTVar3->components[local_40];
    if (CVar1 == CHANNEL_ZERO) {
      pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_40);
      fVar5 = 0.0;
      *pfVar4 = 0.0;
    }
    else if (CVar1 == CHANNEL_ONE) {
      pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_40);
      fVar5 = 1.0;
      *pfVar4 = 1.0;
    }
    else if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT) {
      pfVar4 = rr::GenericVec4::getAccess<float>(&sampler->borderColor);
      fVar5 = pfVar4[(int)CVar1];
      pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_40);
      *pfVar4 = fVar5;
    }
    else {
      pfVar4 = rr::GenericVec4::getAccess<float>(&sampler->borderColor);
      uVar7 = (ulong)(uint)local_48;
      fVar5 = de::clamp<float>(pfVar4[(int)CVar1],local_48,1.0);
      pfVar4 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_40);
      *pfVar4 = fVar5;
    }
    uVar6 = (ulong)(uint)fVar5;
  }
  VVar8.m_data[2] = (float)(int)uVar7;
  VVar8.m_data[3] = (float)(int)(uVar7 >> 0x20);
  VVar8.m_data[0] = (float)(int)uVar6;
  VVar8.m_data[1] = (float)(int)(uVar6 >> 0x20);
  return (Vec4)VVar8.m_data;
}

Assistant:

static tcu::Vec4 getTextureBorderColorFloat (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const bool						isFloat			= channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool						isSigned		= channelClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const float						valueMin		= (isSigned) ? (-1.0f) : (0.0f);
	const float						valueMax		= 1.0f;
	Vec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0.0f;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1.0f;
		else if (isFloat)
		{
			// floating point values are not clamped
			result[c] = sampler.borderColor.getAccess<float>()[(int)map];
		}
		else
		{
			// fixed point values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<float>()[(int)map], valueMin, valueMax);
		}
	}

	return result;
}